

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.h
# Opt level: O0

void io::throw_on_overflow::on_overflow<int>(int *param_1)

{
  integer_overflow *this;
  int *param_0_local;
  
  this = (integer_overflow *)__cxa_allocate_exception();
  memset(this,0,0x290);
  error::integer_overflow::integer_overflow(this);
  __cxa_throw(this,&error::integer_overflow::typeinfo,error::integer_overflow::~integer_overflow);
}

Assistant:

static void on_overflow(T&){
                        throw error::integer_overflow();
                }